

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O1

bool __thiscall QGroupBoxPrivate::shouldHandleKeyEvent(QGroupBoxPrivate *this,QKeyEvent *keyEvent)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QList<Qt::Key> local_58;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)&(this->super_QWidgetPrivate).field_0x8;
  lVar3 = *(long *)(lVar4 + 0x20);
  if ((((*(byte *)(lVar3 + 8) & 1) != 0) || (*(char *)(*(long *)(lVar4 + 8) + 0x279) != '\x01')) ||
     (*(short *)(keyEvent + 0x50) < 0)) {
    bVar5 = false;
    goto LAB_00412f76;
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d._0_4_ = 0xaaaaaaaa;
  local_58.d.d._4_4_ = 0xaaaaaaaa;
  local_58.d.ptr._0_4_ = 0xaaaaaaaa;
  local_58.d.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
            (&local_40,QGuiApplicationPrivate::platform_theme,0x28);
  qvariant_cast<QList<Qt::Key>>(&local_58,&local_40);
  ::QVariant::~QVariant(&local_40);
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_00412f43:
    lVar3 = -1;
  }
  else {
    lVar4 = -4;
    do {
      lVar1 = local_58.d.size * -4 + lVar4;
      if (lVar1 == -4) goto LAB_00412f3d;
      lVar3 = lVar4 + 4;
      piVar2 = (int *)(CONCAT44(local_58.d.ptr._4_4_,local_58.d.ptr._0_4_) + 4 + lVar4);
      lVar4 = lVar3;
    } while (*piVar2 != *(int *)(keyEvent + 0x40));
    lVar3 = lVar3 >> 2;
LAB_00412f3d:
    if (lVar1 == -4) goto LAB_00412f43;
  }
  bVar5 = lVar3 != -1;
  piVar2 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),4,0x10);
    }
  }
LAB_00412f76:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QGroupBoxPrivate::shouldHandleKeyEvent(const QKeyEvent *keyEvent) const
{
    Q_Q(const QGroupBox);

    if (!q->isEnabled() || !q->isCheckable() || keyEvent->isAutoRepeat())
        return false;

    const QList<Qt::Key> buttonPressKeys = QGuiApplicationPrivate::platformTheme()
                                           ->themeHint(QPlatformTheme::ButtonPressKeys)
                                           .value<QList<Qt::Key>>();
    return buttonPressKeys.contains(keyEvent->key());
}